

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void * append_new(t_symbol *why,int argc,t_atom *argv)

{
  t_object *owner;
  t_symbol *ptVar1;
  _outlet *p_Var2;
  void *pvVar3;
  undefined8 *local_50;
  t_appendvariable *sp;
  t_atom *varvec;
  t_atom at;
  int i;
  int varcount;
  t_append *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *why_local;
  
  owner = (t_object *)pd_new(append_class);
  ptVar1 = atom_getsymbolarg(0,argc,argv);
  p_Var2 = (_outlet *)template_getbindsym(ptVar1);
  owner[1].te_outlet = p_Var2;
  if (argc < 2) {
    at.a_w._4_4_ = 1;
    sp = (t_appendvariable *)&varvec;
    varvec._0_4_ = 2;
    at._0_8_ = &s_;
  }
  else {
    at.a_w._4_4_ = argc + -1;
    sp = (t_appendvariable *)(argv + 1);
  }
  pvVar3 = getbytes((long)(int)at.a_w._4_4_ << 4);
  *(void **)&owner[1].te_xpix = pvVar3;
  *(undefined4 *)&owner[1].te_inlet = at.a_w._4_4_;
  at.a_w.w_float = 0.0;
  local_50 = *(undefined8 **)&owner[1].te_xpix;
  for (; at.a_w.w_index < (int)at.a_w._4_4_; at.a_w.w_index = at.a_w.w_index + 1) {
    ptVar1 = atom_getsymbolarg(at.a_w.w_index,at.a_w._4_4_,(t_atom *)sp);
    *local_50 = ptVar1;
    *(undefined4 *)(local_50 + 1) = 0;
    if (at.a_w.w_index != 0) {
      floatinlet_new(owner,(t_float *)(local_50 + 1));
    }
    local_50 = local_50 + 2;
  }
  pointerinlet_new(owner,(t_gpointer *)(owner + 1));
  outlet_new(owner,&s_pointer);
  gpointer_init((t_gpointer *)(owner + 1));
  return owner;
}

Assistant:

static void *append_new(t_symbol *why, int argc, t_atom *argv)
{
    t_append *x = (t_append *)pd_new(append_class);
    int varcount, i;
    t_atom at, *varvec;
    t_appendvariable *sp;

    x->x_templatesym = template_getbindsym(atom_getsymbolarg(0, argc, argv));
    if (argc < 2)
    {
        varcount = 1;
        varvec = &at;
        SETSYMBOL(&at, &s_);
    }
    else varcount = argc - 1, varvec = argv + 1;
    x->x_variables
        = (t_appendvariable *)getbytes(varcount * sizeof (*x->x_variables));
    x->x_nin = varcount;
    for (i = 0, sp = x->x_variables; i < varcount; i++, sp++)
    {
        sp->gv_sym = atom_getsymbolarg(i, varcount, varvec);
        sp->gv_f = 0;
        if (i) floatinlet_new(&x->x_obj, &sp->gv_f);
    }
    pointerinlet_new(&x->x_obj, &x->x_gp);
    outlet_new(&x->x_obj, &s_pointer);
    gpointer_init(&x->x_gp);
    return (x);
}